

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O2

void __thiscall
vkt::anon_unknown_0::ShaderCase::initPrograms(ShaderCase *this,SourceCollections *sourceCollection)

{
  ValueBlock *pVVar1;
  CaseType CVar2;
  pointer pVVar3;
  pointer pPVar4;
  size_t progNdx;
  pointer pPVar5;
  DataType DVar6;
  int iVar7;
  DataType DVar8;
  int iVar9;
  char *pcVar10;
  ostream *poVar11;
  char *pcVar12;
  ProgramSources *pPVar13;
  InternalError *this_00;
  ValueBlock *valueBlock;
  ValueBlock *valueBlock_00;
  long lVar14;
  long lVar15;
  ulong uVar16;
  string *psVar17;
  string *psVar18;
  ulong uVar19;
  size_t ndx_1;
  size_t ndx;
  ProgramSources *dst;
  int local_610;
  StringTemplate tmpl;
  string local_5a0;
  ProgramSources *local_580;
  undefined1 local_578 [40];
  vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> specializedSources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  undefined1 local_500 [40];
  ostringstream decl;
  vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> local_4d0;
  int local_4b8;
  string local_360;
  string local_340;
  ostringstream output;
  string local_318 [368];
  ostringstream setup;
  
  std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::vector
            (&specializedSources,
             ((long)(this->m_spec).programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_spec).programs.
                   super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xf0,(allocator_type *)&decl);
  pPVar5 = specializedSources.
           super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_spec).expectResult != EXPECT_PASS) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Only EXPECT_PASS is supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktShaderLibrary.cpp"
               ,0x6be);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  CVar2 = (this->m_spec).caseType;
  if (CVar2 == CASETYPE_VERTEX_ONLY) {
    local_580 = specializedSources.
                super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
                _M_impl.super__Vector_impl_data._M_start;
    psVar17 = *(string **)
               &(((this->m_spec).programs.
                  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                  ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&output);
    std::operator<<((ostream *)&output,"gl_Position = dEQP_Position;\n");
    std::operator<<((ostream *)&decl,"layout(location = 0) in highp vec4 dEQP_Position;\n");
    pVVar1 = &(this->m_spec).values;
    local_610 = 1;
    lVar15 = 0x18;
    uVar16 = 0;
    while( true ) {
      pVVar3 = (this->m_spec).values.inputs.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_spec).values.inputs.
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar3) / 0x50) <= uVar16)
      break;
      DVar8 = *(DataType *)((long)pVVar3 + lVar15 + -0x10);
      pcVar10 = glu::getDataTypeName(DVar8);
      DVar6 = getTransportType(DVar8);
      pcVar12 = glu::getDataTypeName(DVar6);
      iVar9 = getNumTransportLocations(DVar8);
      poVar11 = std::operator<<((ostream *)&decl,"layout(location = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_610);
      std::operator<<(poVar11,") in ");
      if (DVar8 == DVar6) {
        poVar11 = std::operator<<((ostream *)&decl,pcVar12);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = std::operator<<(poVar11,(string *)((long)&(pVVar3->type).m_type + lVar15));
        pcVar10 = ";\n";
      }
      else {
        poVar11 = std::operator<<((ostream *)&decl,pcVar12);
        poVar11 = std::operator<<(poVar11," a_");
        psVar18 = (string *)((long)&(pVVar3->type).m_type + lVar15);
        poVar11 = std::operator<<(poVar11,psVar18);
        std::operator<<(poVar11,";\n");
        poVar11 = std::operator<<((ostream *)&setup,pcVar10);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = std::operator<<(poVar11,psVar18);
        poVar11 = std::operator<<(poVar11," = ");
        poVar11 = std::operator<<(poVar11,pcVar10);
        poVar11 = std::operator<<(poVar11,"(a_");
        poVar11 = std::operator<<(poVar11,psVar18);
        pcVar10 = ");\n";
      }
      std::operator<<(poVar11,pcVar10);
      local_610 = local_610 + iVar9;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x50;
    }
    declareUniforms(&decl,pVVar1);
    uVar16 = 0;
    lVar15 = 0x18;
    local_610 = 0;
    while( true ) {
      pVVar3 = (this->m_spec).values.outputs.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_spec).values.outputs.
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar3) / 0x50) <= uVar16)
      break;
      DVar8 = *(DataType *)((long)pVVar3 + lVar15 + -0x10);
      pcVar10 = glu::getDataTypeName(DVar8);
      DVar6 = getTransportType(DVar8);
      pcVar12 = glu::getDataTypeName(DVar6);
      iVar9 = getNumTransportLocations(DVar8);
      poVar11 = std::operator<<((ostream *)&decl,"layout(location = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_610);
      std::operator<<(poVar11,") flat out ");
      if (DVar8 == DVar6) {
        poVar11 = std::operator<<((ostream *)&decl,pcVar12);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = std::operator<<(poVar11,(string *)((long)&(pVVar3->type).m_type + lVar15));
        pcVar10 = ";\n";
      }
      else {
        poVar11 = std::operator<<((ostream *)&decl,pcVar12);
        poVar11 = std::operator<<(poVar11," v_");
        psVar18 = (string *)((long)&(pVVar3->type).m_type + lVar15);
        poVar11 = std::operator<<(poVar11,psVar18);
        std::operator<<(poVar11,";\n");
        poVar11 = std::operator<<((ostream *)&decl,pcVar10);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = std::operator<<(poVar11,psVar18);
        std::operator<<(poVar11,";\n");
        poVar11 = std::operator<<((ostream *)&output,"v_");
        poVar11 = std::operator<<(poVar11,psVar18);
        poVar11 = std::operator<<(poVar11," = ");
        poVar11 = std::operator<<(poVar11,pcVar12);
        poVar11 = std::operator<<(poVar11,"(");
        poVar11 = std::operator<<(poVar11,psVar18);
        pcVar10 = ");\n";
      }
      std::operator<<(poVar11,pcVar10);
      local_610 = local_610 + iVar9;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x50;
    }
    params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &params._M_t._M_impl.super__Rb_tree_header._M_header;
    params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl,(char (*) [13])0x95e5be,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&params,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tmpl);
    std::__cxx11::string::~string((string *)local_578);
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl,(char (*) [6])0x95e407,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&params,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tmpl);
    std::__cxx11::string::~string((string *)local_578);
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl,(char (*) [7])0xa21403,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&params,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tmpl);
    std::__cxx11::string::~string((string *)local_578);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[20],_const_char_(&)[12],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [12])0x9e0287);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&params,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tmpl);
    tcu::StringTemplate::StringTemplate(&tmpl,psVar17);
    tcu::StringTemplate::specialize((string *)local_578,&tmpl,&params);
    glu::sl::injectExtensionRequirements
              (&local_5a0,(string *)local_578,
               &((this->m_spec).programs.
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions,SHADERTYPE_VERTEX);
    std::__cxx11::string::~string((string *)local_578);
    tcu::StringTemplate::~StringTemplate(&tmpl);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&params._M_t);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
    glu::VertexSource::VertexSource((VertexSource *)local_500,&local_5a0);
    pPVar13 = glu::ProgramSources::operator<<(local_580,(ShaderSource *)local_500);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup);
    pcVar10 = glu::getGLSLVersionDeclaration((this->m_spec).targetVersion);
    poVar11 = std::operator<<((ostream *)&decl,pcVar10);
    std::operator<<(poVar11,"\n");
    std::operator<<((ostream *)&decl,"precision highp float;\n");
    std::operator<<((ostream *)&decl,"precision highp int;\n");
    std::operator<<((ostream *)&decl,"\n");
    std::operator<<((ostream *)&decl,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
    std::operator<<((ostream *)&decl,"\n");
    glu::sl::genCompareFunctions(&decl,pVVar1,false);
    std::operator<<((ostream *)&decl,"\n");
    uVar16 = 0;
    lVar15 = 0x18;
    local_610 = 0;
    while( true ) {
      pVVar3 = (this->m_spec).values.outputs.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar10 = (char *)0x50;
      if ((ulong)(((long)(this->m_spec).values.outputs.
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar3) / 0x50) <= uVar16)
      break;
      DVar8 = *(DataType *)((long)pVVar3 + lVar15 + -0x10);
      pcVar10 = glu::getDataTypeName(DVar8);
      DVar6 = getTransportType(DVar8);
      pcVar12 = glu::getDataTypeName(DVar6);
      iVar9 = getNumTransportLocations(DVar8);
      poVar11 = std::operator<<((ostream *)&decl,"layout(location = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_610);
      poVar11 = std::operator<<(poVar11,") flat in ");
      poVar11 = std::operator<<(poVar11,pcVar12);
      poVar11 = std::operator<<(poVar11," ");
      pcVar12 = "v_";
      if (DVar8 == DVar6) {
        pcVar12 = "";
      }
      poVar11 = std::operator<<(poVar11,pcVar12);
      psVar18 = (string *)((long)&(pVVar3->type).m_type + lVar15);
      poVar11 = std::operator<<(poVar11,psVar18);
      std::operator<<(poVar11,";\n");
      if (DVar8 != DVar6) {
        poVar11 = std::operator<<((ostream *)&setup,"\t");
        poVar11 = std::operator<<(poVar11,pcVar10);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = std::operator<<(poVar11,psVar18);
        poVar11 = std::operator<<(poVar11," = ");
        poVar11 = std::operator<<(poVar11,pcVar10);
        poVar11 = std::operator<<(poVar11,"(v_");
        poVar11 = std::operator<<(poVar11,psVar18);
        std::operator<<(poVar11,");\n");
      }
      local_610 = local_610 + iVar9;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x50;
    }
    declareReferenceBlock(&decl,pVVar1);
    std::operator<<((ostream *)&decl,"\n");
    std::operator<<((ostream *)&decl,"void main()\n");
    std::operator<<((ostream *)&decl,"{\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&decl,(string *)&tmpl);
    std::__cxx11::string::~string((string *)&tmpl);
    std::operator<<((ostream *)&decl,"\t");
    genCompareOp(&decl,(char *)pVVar1,valueBlock_00,pcVar10);
    std::operator<<((ostream *)&decl,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
    glu::FragmentSource::FragmentSource((FragmentSource *)&output,(string *)&params);
    glu::ProgramSources::operator<<(pPVar13,(ShaderSource *)&output);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::~string((string *)&params);
    std::__cxx11::string::~string((string *)(local_500 + 8));
    psVar17 = &local_5a0;
  }
  else {
    if (CVar2 != CASETYPE_FRAGMENT_ONLY) {
      lVar15 = 0xd0;
      lVar14 = 0;
      uVar16 = 0;
      while( true ) {
        pPVar4 = (this->m_spec).programs.
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->m_spec).programs.
                           super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4) / 0xf0) <=
            uVar16) break;
        _decl = (pointer)&this->m_spec;
        std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::vector
                  (&local_4d0,
                   (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                    *)((long)&(pPVar4->sources).sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      + lVar15));
        pPVar5 = specializedSources.
                 super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_4b8 = 4;
        dst = (ProgramSources *)
              ((long)&(specializedSources.
                       super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                       ._M_impl.super__Vector_impl_data._M_start)->sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar14);
        pPVar4 = (this->m_spec).programs.
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar13 = (ProgramSources *)((long)pPVar4 + lVar15 + -0xd0);
        specializeShaderSources
                  (dst,pPVar13,(ProgramSpecializationParams *)&decl,SHADERTYPE_VERTEX,
                   vkt::(anonymous_namespace)::generateVertexSpecialization_abi_cxx11_);
        specializeShaderSources
                  (dst,pPVar13,(ProgramSpecializationParams *)&decl,SHADERTYPE_FRAGMENT,
                   vkt::(anonymous_namespace)::generateFragmentSpecialization_abi_cxx11_);
        specializeShaderSources
                  (dst,pPVar13,(ProgramSpecializationParams *)&decl,SHADERTYPE_GEOMETRY,
                   vkt::(anonymous_namespace)::generateGeometrySpecialization_abi_cxx11_);
        specializeShaderSources
                  (dst,pPVar13,(ProgramSpecializationParams *)&decl,SHADERTYPE_TESSELLATION_CONTROL,
                   vkt::(anonymous_namespace)::generateTessControlSpecialization_abi_cxx11_);
        specializeShaderSources
                  (dst,pPVar13,(ProgramSpecializationParams *)&decl,
                   SHADERTYPE_TESSELLATION_EVALUATION,
                   vkt::(anonymous_namespace)::generateTessEvalSpecialization_abi_cxx11_);
        (&pPVar5->separable)[lVar14] = *(bool *)((long)(pPVar4->sources).sources + lVar15 + -8);
        std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
        ~vector(&local_4d0);
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 0xf0;
        lVar14 = lVar14 + 0xd0;
      }
      goto LAB_0042ae16;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
    pcVar10 = glu::getGLSLVersionDeclaration((this->m_spec).targetVersion);
    poVar11 = std::operator<<((ostream *)&decl,pcVar10);
    std::operator<<(poVar11,"\n");
    std::operator<<((ostream *)&decl,"precision highp float;\n");
    std::operator<<((ostream *)&decl,"precision highp int;\n");
    std::operator<<((ostream *)&decl,"\n");
    std::operator<<((ostream *)&decl,"layout(location = 0) in highp vec4 dEQP_Position;\n");
    local_610 = 1;
    lVar15 = 0x18;
    pVVar1 = &(this->m_spec).values;
    uVar16 = 0;
    iVar9 = 0;
    while( true ) {
      pVVar3 = (this->m_spec).values.inputs.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_spec).values.inputs.
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar3) / 0x50) <= uVar16)
      break;
      DVar8 = *(DataType *)((long)pVVar3 + lVar15 + -0x10);
      DVar6 = getTransportType(DVar8);
      pcVar10 = glu::getDataTypeName(DVar6);
      iVar7 = getNumTransportLocations(DVar8);
      poVar11 = std::operator<<((ostream *)&decl,"layout(location = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_610);
      poVar11 = std::operator<<(poVar11,") in ");
      poVar11 = std::operator<<(poVar11,pcVar10);
      poVar11 = std::operator<<(poVar11," a_");
      psVar18 = (string *)((long)&(pVVar3->type).m_type + lVar15);
      poVar11 = std::operator<<(poVar11,psVar18);
      std::operator<<(poVar11,";\n");
      poVar11 = std::operator<<((ostream *)&decl,"layout(location = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar9);
      poVar11 = std::operator<<(poVar11,") flat out ");
      poVar11 = std::operator<<(poVar11,pcVar10);
      poVar11 = std::operator<<(poVar11," ");
      pcVar10 = "v_";
      if (DVar6 == DVar8) {
        pcVar10 = "";
      }
      poVar11 = std::operator<<(poVar11,pcVar10);
      poVar11 = std::operator<<(poVar11,psVar18);
      std::operator<<(poVar11,";\n");
      local_610 = local_610 + iVar7;
      iVar9 = iVar9 + iVar7;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x50;
    }
    std::operator<<((ostream *)&decl,"\n");
    std::operator<<((ostream *)&decl,"void main()\n");
    std::operator<<((ostream *)&decl,"{\n");
    std::operator<<((ostream *)&decl,"\tgl_Position = dEQP_Position;\n");
    lVar15 = 0x18;
    uVar16 = 0;
    while( true ) {
      pVVar3 = (this->m_spec).values.inputs.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar10 = (char *)0x50;
      if ((ulong)(((long)(this->m_spec).values.inputs.
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar3) / 0x50) <= uVar16)
      break;
      poVar11 = std::operator<<((ostream *)&decl,"\t");
      DVar8 = getTransportType(*(DataType *)((long)pVVar3 + lVar15 + -0x10));
      pcVar10 = "";
      if (DVar8 != *(DataType *)((long)pVVar3 + lVar15 + -0x10)) {
        pcVar10 = "v_";
      }
      poVar11 = std::operator<<(poVar11,pcVar10);
      psVar18 = (string *)((long)&(pVVar3->type).m_type + lVar15);
      poVar11 = std::operator<<(poVar11,psVar18);
      poVar11 = std::operator<<(poVar11," = a_");
      poVar11 = std::operator<<(poVar11,psVar18);
      std::operator<<(poVar11,";\n");
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x50;
    }
    std::operator<<((ostream *)&decl,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
    glu::VertexSource::VertexSource((VertexSource *)local_500,&local_340);
    local_580 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_500);
    psVar17 = (((this->m_spec).programs.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_start)->sources).sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&output);
    glu::sl::genCompareFunctions(&decl,pVVar1,false);
    genCompareOp(&output,(char *)pVVar1,valueBlock,pcVar10);
    std::operator<<((ostream *)&decl,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
    uVar16 = 0;
    lVar15 = 0x18;
    local_610 = 0;
    while( true ) {
      pVVar3 = (this->m_spec).values.inputs.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_spec).values.inputs.
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar3) / 0x50) <= uVar16)
      break;
      DVar8 = *(DataType *)((long)pVVar3 + lVar15 + -0x10);
      pcVar10 = glu::getDataTypeName(DVar8);
      DVar6 = getTransportType(DVar8);
      pcVar12 = glu::getDataTypeName(DVar6);
      iVar9 = getNumTransportLocations(DVar8);
      poVar11 = std::operator<<((ostream *)&decl,"layout(location = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_610);
      std::operator<<(poVar11,") flat in ");
      if (DVar8 == DVar6) {
        poVar11 = std::operator<<((ostream *)&decl,pcVar12);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = std::operator<<(poVar11,(string *)((long)&(pVVar3->type).m_type + lVar15));
        pcVar10 = ";\n";
      }
      else {
        poVar11 = std::operator<<((ostream *)&decl,pcVar12);
        poVar11 = std::operator<<(poVar11," v_");
        psVar18 = (string *)((long)&(pVVar3->type).m_type + lVar15);
        poVar11 = std::operator<<(poVar11,psVar18);
        std::operator<<(poVar11,";\n");
        poVar11 = std::operator<<((ostream *)&setup,pcVar10);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = std::operator<<(poVar11,psVar18);
        poVar11 = std::operator<<(poVar11," = ");
        poVar11 = std::operator<<(poVar11,pcVar10);
        poVar11 = std::operator<<(poVar11,"(v_");
        poVar11 = std::operator<<(poVar11,psVar18);
        pcVar10 = ");\n";
      }
      std::operator<<(poVar11,pcVar10);
      local_610 = local_610 + iVar9;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x50;
    }
    declareUniforms(&decl,pVVar1);
    declareReferenceBlock(&decl,pVVar1);
    lVar15 = 0x18;
    uVar16 = 0;
    while( true ) {
      pVVar3 = (this->m_spec).values.outputs.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_spec).values.outputs.
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar3) / 0x50) <= uVar16)
      break;
      pcVar10 = glu::getDataTypeName(*(DataType *)((long)pVVar3 + lVar15 + -0x10));
      poVar11 = std::operator<<((ostream *)&decl,pcVar10);
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = std::operator<<(poVar11,(string *)((long)&(pVVar3->type).m_type + lVar15));
      std::operator<<(poVar11,";\n");
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x50;
    }
    params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &params._M_t._M_impl.super__Rb_tree_header._M_header;
    params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl,(char (*) [13])0x95e5be,&local_5a0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&params,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tmpl);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl,(char (*) [6])0x95e407,&local_5a0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&params,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tmpl);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl,(char (*) [7])0xa21403,&local_5a0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&params,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tmpl);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[20],_const_char_(&)[15],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [15])"dEQP_FragColor");
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&params,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&tmpl);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tmpl);
    tcu::StringTemplate::StringTemplate(&tmpl,psVar17);
    tcu::StringTemplate::specialize(&local_5a0,&tmpl,&params);
    glu::sl::injectExtensionRequirements
              (&local_360,&local_5a0,
               &((this->m_spec).programs.
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions,SHADERTYPE_FRAGMENT)
    ;
    std::__cxx11::string::~string((string *)&local_5a0);
    tcu::StringTemplate::~StringTemplate(&tmpl);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&params._M_t);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_578,&local_360);
    glu::ProgramSources::operator<<(local_580,(ShaderSource *)local_578);
    std::__cxx11::string::~string((string *)(local_578 + 8));
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)(local_500 + 8));
    psVar17 = &local_340;
  }
  std::__cxx11::string::~string((string *)psVar17);
LAB_0042ae16:
  lVar15 = 0;
  for (uVar16 = 0;
      uVar16 < (ulong)(((long)specializedSources.
                              super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)specializedSources.
                             super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xd0); uVar16 = uVar16 + 1
      ) {
    lVar14 = 0;
    for (uVar19 = 0; uVar19 != 6; uVar19 = uVar19 + 1) {
      progNdx = *(size_t *)
                 ((long)&(specializedSources.
                          super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                          ._M_impl.super__Vector_impl_data._M_start)->sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14 + lVar15);
      if (progNdx !=
          *(size_t *)
           ((long)&(specializedSources.
                    super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
                    _M_impl.super__Vector_impl_data._M_start)->sources[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + lVar14 + lVar15)) {
        vkt::(anonymous_namespace)::getShaderName_abi_cxx11_
                  ((string *)&decl,(_anonymous_namespace_ *)(uVar19 & 0xffffffff),(ShaderType)uVar16
                   ,progNdx);
        pPVar13 = ::vk::ProgramCollection<glu::ProgramSources>::add
                            (&sourceCollection->glslSources,(string *)&decl);
        std::__cxx11::string::~string((string *)&decl);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&pPVar13->sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar14),
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&(specializedSources.
                                super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                                ._M_impl.super__Vector_impl_data._M_start)->sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar14 + lVar15));
      }
      lVar14 = lVar14 + 0x18;
    }
    lVar15 = lVar15 + 0xd0;
  }
  std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::~vector
            (&specializedSources);
  return;
}

Assistant:

void ShaderCase::initPrograms (SourceCollections& sourceCollection) const
{
	vector<ProgramSources>	specializedSources	(m_spec.programs.size());

	DE_ASSERT(isValid(m_spec));

	if (m_spec.expectResult != glu::sl::EXPECT_PASS)
		TCU_THROW(InternalError, "Only EXPECT_PASS is supported");

	if (m_spec.caseType == glu::sl::CASETYPE_VERTEX_ONLY)
	{
		DE_ASSERT(m_spec.programs.size() == 1 && m_spec.programs[0].sources.sources[glu::SHADERTYPE_VERTEX].size() == 1);
		specializedSources[0] << glu::VertexSource(specializeVertexShader(m_spec, m_spec.programs[0].sources.sources[glu::SHADERTYPE_VERTEX][0]))
							  << glu::FragmentSource(genFragmentShader(m_spec));
	}
	else if (m_spec.caseType == glu::sl::CASETYPE_FRAGMENT_ONLY)
	{
		DE_ASSERT(m_spec.programs.size() == 1 && m_spec.programs[0].sources.sources[glu::SHADERTYPE_FRAGMENT].size() == 1);
		specializedSources[0] << glu::VertexSource(genVertexShader(m_spec))
							  << glu::FragmentSource(specializeFragmentShader(m_spec, m_spec.programs[0].sources.sources[glu::SHADERTYPE_FRAGMENT][0]));
	}
	else
	{
		DE_ASSERT(m_spec.caseType == glu::sl::CASETYPE_COMPLETE);

		const int	maxPatchVertices	= 4; // \todo [2015-08-05 pyry] Query

		for (size_t progNdx = 0; progNdx < m_spec.programs.size(); progNdx++)
		{
			const ProgramSpecializationParams	progSpecParams	(m_spec, m_spec.programs[progNdx].requiredExtensions, maxPatchVertices);

			specializeProgramSources(specializedSources[progNdx], m_spec.programs[progNdx].sources, progSpecParams);
		}
	}

	for (size_t progNdx = 0; progNdx < specializedSources.size(); progNdx++)
	{
		for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
		{
			if (!specializedSources[progNdx].sources[shaderType].empty())
			{
				glu::ProgramSources& curSrc	= sourceCollection.glslSources.add(getShaderName((glu::ShaderType)shaderType, progNdx));
				curSrc.sources[shaderType] = specializedSources[progNdx].sources[shaderType];
			}
		}
	}
}